

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesmsg.cpp
# Opt level: O1

void __thiscall
TrodesMsg::processArg
          (TrodesMsg *this,char c,vector<unsigned_char,_std::allocator<unsigned_char>_> *a)

{
  pointer puVar1;
  pointer puVar2;
  size_t sVar3;
  byte *__src;
  string *psVar4;
  zframe_t *fr;
  zframe_t *local_20;
  
  if (c == 'b') {
    local_20 = zmsg_pop(this->msg);
    puVar1 = (a->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((a->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar1) {
      (a->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
    }
    if (local_20 != (zframe_t *)0x0) {
      puVar2 = (a->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      sVar3 = zframe_size(local_20);
      if ((long)puVar2 - (long)puVar1 != sVar3) {
        sVar3 = zframe_size(local_20);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(a,sVar3);
      }
      puVar1 = (a->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      __src = zframe_data(local_20);
      sVar3 = zframe_size(local_20);
      memcpy(puVar1,__src,sVar3);
    }
    zframe_destroy(&local_20);
    return;
  }
  psVar4 = (string *)__cxa_allocate_exception(0x20);
  *(string **)psVar4 = psVar4 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            (psVar4,"Could not read message. Expected different type, got byte vector","");
  __cxa_throw(psVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void TrodesMsg::processArg(const char c, std::vector<byte> &a){
    if(c != 'b') throw std::string(PROCESSERROR "byte vector");
    zframe_t *fr = zmsg_pop(msg);
    a.clear();
    if(fr){
        if(a.size() != zframe_size(fr))
            a.resize(zframe_size(fr));
        memcpy(a.data(), zframe_data(fr), zframe_size(fr));
    }
    zframe_destroy(&fr);
}